

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
glslang::TSampler::set(TSampler *this,TBasicType t,TSamplerDim d,bool a,bool s,bool m)

{
  bool m_local;
  bool s_local;
  bool a_local;
  TSamplerDim d_local;
  TBasicType t_local;
  TSampler *this_local;
  
  clear(this);
  *this = (TSampler)((uint)*this & 0xffffff00 | t & 0xff);
  *this = (TSampler)((uint)*this & 0xffff00ff | (d & 0xff) << 8);
  *this = (TSampler)((uint)*this & 0xfffeffff | (uint)a << 0x10);
  *this = (TSampler)((uint)*this & 0xfffdffff | (uint)s << 0x11);
  *this = (TSampler)((uint)*this & 0xfffbffff | (uint)m << 0x12);
  *this = (TSampler)((uint)*this & 0xffefffff | 0x100000);
  return;
}

Assistant:

void set(TBasicType t, TSamplerDim d, bool a = false, bool s = false, bool m = false)
    {
        clear();
        type = t;
        dim = d;
        arrayed = a;
        shadow = s;
        ms = m;
        combined = true;
    }